

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

void drain_tunnel(Curl_cfilter *cf,Curl_easy *data,tunnel_stream *tunnel)

{
  byte local_21;
  uchar bits;
  tunnel_stream *tunnel_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  local_21 = 1;
  if (((((byte)tunnel->field_0xa4 >> 1 & 1) == 0) && (((byte)tunnel->field_0xa4 >> 2 & 1) == 0)) &&
     (tunnel->upload_blocked_len != 0)) {
    local_21 = 3;
  }
  if ((data->state).select_bits != local_21) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"[%d] DRAIN select_bits=%x",(ulong)(uint)tunnel->stream_id,
                        (ulong)local_21);
    }
    (data->state).select_bits = local_21;
    Curl_expire(data,0,EXPIRE_RUN_NOW);
  }
  return;
}

Assistant:

static void drain_tunnel(struct Curl_cfilter *cf,
                         struct Curl_easy *data,
                         struct tunnel_stream *tunnel)
{
  unsigned char bits;

  (void)cf;
  bits = CURL_CSELECT_IN;
  if(!tunnel->closed && !tunnel->reset && tunnel->upload_blocked_len)
    bits |= CURL_CSELECT_OUT;
  if(data->state.select_bits != bits) {
    CURL_TRC_CF(data, cf, "[%d] DRAIN select_bits=%x",
                tunnel->stream_id, bits);
    data->state.select_bits = bits;
    Curl_expire(data, 0, EXPIRE_RUN_NOW);
  }
}